

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O1

void __thiscall czh::lexer::Lexer::skip(Lexer *this)

{
  char cVar1;
  size_t sVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar3;
  element_type *peVar4;
  int iVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  string local_a0;
  undefined1 local_80 [8];
  _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_78;
  size_t local_50;
  size_t local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar4 = (this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  while (((iVar3 = (*peVar4->_vptr_File[7])(), (char)iVar3 != '\0' && (-1 < this->ch)) &&
         (iVar3 = isspace((int)this->ch), iVar3 != 0))) {
    (this->codepos).pos = (this->codepos).pos + 1;
    iVar3 = (*((this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->_vptr_File[5])();
    this->ch = (char)iVar3;
    peVar4 = (this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  iVar3 = (*((this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_File[7])();
  if ((char)iVar3 != '\0') {
    cVar1 = this->ch;
    while (cVar1 == '<') {
      sVar2 = (this->codepos).pos;
      peVar4 = (this->codepos).code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      this_00 = (this->codepos).code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
        }
      }
      (this->codepos).pos = (this->codepos).pos + 1;
      iVar3 = (*((this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->_vptr_File[5])();
      iVar5 = 0;
      while( true ) {
        this->ch = (char)iVar3;
        iVar3 = (*((this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_vptr_File[7])();
        if (((char)iVar3 == '\0') || ((cVar1 = this->ch, cVar1 == '>' && (iVar5 == 0)))) break;
        (this->codepos).pos = (this->codepos).pos + 1;
        iVar5 = (iVar5 + (uint)(cVar1 == '<')) - (uint)(cVar1 == '>');
        iVar3 = (*((this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_vptr_File[5])();
      }
      if ((iVar5 != 0) &&
         (iVar3 = (*((this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_vptr_File[7])(), (char)iVar3 == '\0')) {
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        local_a0._M_dataplus._M_p._0_4_ = 0x3c;
        local_80._0_4_ = UNEXPECTED;
        local_78._M_index = '\0';
        std::
        variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string,czh::value::Reference,std::vector<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>,std::allocator<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>>>>
        ::operator=((variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string,czh::value::Reference,std::vector<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>,std::allocator<std::variant<czh::value::Null,int,long_long,double,bool,std::__cxx11::string>>>>
                     *)&((Token *)local_80)->what,(int *)&local_a0);
        local_48 = 1;
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        local_50 = sVar2;
        local_40 = peVar4;
        local_38._M_pi = this_00;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,"Expected \'>\' to match this \'<\'.","");
        token::Token::report_error((Token *)local_80,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
        }
        std::__detail::__variant::
        _Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~_Variant_storage((_Variant_storage<false,_czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_czh::value::Reference,_std::vector<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<czh::value::Null,_int,_long_long,_double,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&((Token *)local_80)->what);
      }
      if (this->ch == '>') {
        (this->codepos).pos = (this->codepos).pos + 1;
        iVar3 = (*((this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_vptr_File[5])();
        this->ch = (char)iVar3;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      iVar3 = (*((this->code).super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                )->_vptr_File[7])();
      if ((char)iVar3 == '\0') {
        return;
      }
      cVar1 = this->ch;
    }
  }
  return;
}

Assistant:

void skip()
    {
      while (check_char() && get_character_size() == 1 && isspace(ch))
      {
        ch = get_char();
      }
      while (check_char() && ch == '<')
      {
        int notes = 0;
        auto bak = get_pos().set_size(1);
        ch = get_char();
        while (check_char() && !(ch == '>' && notes == 0))
        {
          if (ch == '<') ++notes;
          if (ch == '>') --notes;
          ch = get_char();
        }
        if (notes != 0 && !check_char())
        {
          token::Token tmp(token::TokenType::UNEXPECTED, static_cast<int>('<'), bak);
          tmp.report_error("Expected '>' to match this '<'.");
        }
        if (ch == '>')
        {
          ch = get_char();
        }
      }
    }